

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Test.h
# Opt level: O3

multimap<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* cppqc::detail::convertLabels
            (multimap<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *__return_storage_ptr__,
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
            *labelsCollected)

{
  _Base_ptr p_Var1;
  _Rb_tree_header *p_Var2;
  undefined1 local_58 [8];
  _Alloc_hider local_50;
  char local_40 [16];
  
  p_Var2 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var2->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var2->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = (labelsCollected->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var2 = &(labelsCollected->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var1 != p_Var2) {
    do {
      local_58 = *(undefined1 (*) [8])(p_Var1 + 2);
      local_50._M_p = local_40;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,*(long *)(p_Var1 + 1),
                 (long)&(p_Var1[1]._M_parent)->_M_color + *(long *)(p_Var1 + 1));
      std::
      _Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::__cxx11::string>,std::_Select1st<std::pair<unsigned_long_const,std::__cxx11::string>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::__cxx11::string>>>
      ::_M_emplace_equal<std::pair<unsigned_long,std::__cxx11::string>>
                ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::__cxx11::string>,std::_Select1st<std::pair<unsigned_long_const,std::__cxx11::string>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::__cxx11::string>>>
                  *)__return_storage_ptr__,
                 (pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_58);
      if (local_50._M_p != local_40) {
        operator_delete(local_50._M_p);
      }
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1);
    } while ((_Rb_tree_header *)p_Var1 != p_Var2);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::multimap<std::size_t, std::string> convertLabels(
    const std::map<std::string, std::size_t>& labelsCollected) {
  std::multimap<std::size_t, std::string> labels;
  for (const auto& elem : labelsCollected) {
    labels.insert(std::make_pair(elem.second, elem.first));
  }
  return labels;
}